

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void psr_new_local(Parser *psr,uint64_t name)

{
  int iVar1;
  Local *pLVar2;
  int iVar3;
  
  iVar3 = psr->locals_count;
  iVar1 = psr->locals_capacity;
  if (iVar3 < iVar1) {
    pLVar2 = psr->locals;
  }
  else {
    psr->locals_capacity = iVar1 * 2;
    pLVar2 = (Local *)realloc(psr->locals,(long)iVar1 << 4);
    psr->locals = pLVar2;
    iVar3 = psr->locals_count;
  }
  psr->locals_count = iVar3 + 1;
  pLVar2[iVar3].name = name;
  return;
}

Assistant:

static void psr_new_local(Parser *psr, uint64_t name) {
	if (psr->locals_count >= psr->locals_capacity) {
		psr->locals_capacity *= 2;
		psr->locals = realloc(psr->locals, sizeof(Local) * psr->locals_capacity);
	}
	psr->locals[psr->locals_count++].name = name;
}